

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_46e7c5::QPDFWordTokenFinder::~QPDFWordTokenFinder(QPDFWordTokenFinder *this)

{
  QPDFWordTokenFinder *this_local;
  
  ~QPDFWordTokenFinder(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

~QPDFWordTokenFinder() override = default;